

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_31::WebSocketPipeImpl::WebSocketPipeImpl(WebSocketPipeImpl *this)

{
  WebSocketPipeImpl *this_local;
  
  WebSocket::WebSocket(&this->super_WebSocket);
  Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)&PTR_send_007d2bc8;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_007d2c30;
  Maybe<kj::WebSocket_&>::Maybe(&this->state);
  Own<kj::WebSocket>::Own(&this->ownState);
  this->aborted = false;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&this->abortedFulfiller,(void *)0x0);
  Maybe<kj::ForkedPromise<void>_>::Maybe(&this->abortedPromise,(void *)0x0);
  return;
}

Assistant:

class WebSocketPipeImpl final: public WebSocket, public kj::Refcounted {
  // Represents one direction of a WebSocket pipe.
  //
  // This class behaves as a "loopback" WebSocket: a message sent using send() is received using
  // receive(), on the same object. This is *not* how WebSocket implementations usually behave.
  // But, this object is actually used to implement only one direction of a bidirectional pipe. At
  // another layer above this, the pipe is actually composed of two WebSocketPipeEnd instances,
  // which layer on top of two WebSocketPipeImpl instances representing the two directions. So,
  // send() calls on a WebSocketPipeImpl instance always come from one of the two WebSocketPipeEnds
  // while receive() calls come from the other end.

public:
  ~WebSocketPipeImpl() noexcept(false) {
    KJ_REQUIRE(state == nullptr || ownState.get() != nullptr,
        "destroying WebSocketPipe with operation still in-progress; probably going to segfault") {
      // Don't std::terminate().
      break;
    }
  }

  void abort() override {
    KJ_IF_MAYBE(s, state) {
      s->abort();
    } else {
      ownState = heap<Aborted>();
      state = *ownState;

      aborted = true;
      KJ_IF_MAYBE(f, abortedFulfiller) {
        f->get()->fulfill();
        abortedFulfiller = nullptr;
      }
    }
  }

  kj::Promise<void> send(kj::ArrayPtr<const byte> message) override {
    KJ_IF_MAYBE(s, state) {
      return s->send(message);
    } else {
      return newAdaptedPromise<void, BlockedSend>(*this, MessagePtr(message));
    }